

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_add(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  char pram;
  short pram_00;
  byte bVar5;
  uint uVar6;
  
  uVar6 = registe_ptr->IP;
  bVar1 = code_ptr[uVar6 + 2];
  bVar2 = bVar1 >> 4;
  bVar5 = bVar1 & 0xf;
  if (code_ptr[uVar6 + 1] == '\x01') {
    if (bVar5 == 2) {
      uVar6 = *register_list[bVar2] + *(int *)(code_ptr + (ulong)uVar6 + 3);
      *register_list[bVar2] = uVar6;
LAB_00103523:
      set_flag(uVar6);
      return 1;
    }
    if (bVar5 == 1) {
      pram_00 = (short)*register_list[bVar2] + *(short *)(code_ptr + (ulong)uVar6 + 3);
      *(short *)register_list[bVar2] = pram_00;
LAB_001034e9:
      set_flag(pram_00);
      return 1;
    }
    if ((bVar1 & 0xf) == 0) {
      pram = (char)*register_list[bVar2] + code_ptr[(ulong)uVar6 + 3];
      *(char *)register_list[bVar2] = pram;
LAB_001034a3:
      set_flag(pram);
      return 1;
    }
  }
  else if (code_ptr[uVar6 + 1] == '\0') {
    bVar3 = (byte)code_ptr[uVar6 + 3] >> 4;
    if (bVar5 == 2) {
      uVar6 = *register_list[bVar2] + *register_list[bVar3];
      *register_list[bVar2] = uVar6;
      goto LAB_00103523;
    }
    if (bVar5 == 1) {
      pram_00 = (short)*register_list[bVar2] + (short)*register_list[bVar3];
      *(short *)register_list[bVar2] = pram_00;
      goto LAB_001034e9;
    }
    if ((bVar1 & 0xf) == 0) {
      pram = (char)*register_list[bVar2] + (char)*register_list[bVar3];
      *(char *)register_list[bVar2] = pram;
      goto LAB_001034a3;
    }
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0xf6;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

int do_add() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1]==0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra += *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra += *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra += *Rb;
			set_flag(*Ra);
		}else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R += temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R += temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R += temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}